

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,EnumType *type,string_view overrideName)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  format_string<const_int_&> fmt;
  format_string<const_std::basic_string_view<char>_&,_std::__cxx11::basic_string<char>_> fmt_00;
  SourceRange referencingRange;
  bool bVar1;
  pointer this_00;
  pointer args;
  char *in_RCX;
  size_t in_RDX;
  Symbol *in_RSI;
  size_t in_RDI;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar2;
  SVInt *value;
  EnumValueSymbol *member;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __end3;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin3;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *__range3;
  bool first;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  EnumValueSymbol *in_stack_fffffffffffffe08;
  pointer in_stack_fffffffffffffe10;
  string_view *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  Scope *in_stack_fffffffffffffe48;
  pointer in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe80;
  SVInt *in_stack_fffffffffffffe88;
  char local_150 [32];
  char *local_130;
  undefined8 local_128;
  SVInt *local_110;
  EnumValueSymbol *local_f8;
  Symbol *local_f0;
  Symbol *local_e8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *this_01;
  undefined7 in_stack_ffffffffffffff38;
  byte bVar3;
  undefined1 local_a0 [80];
  size_t local_50;
  char *local_48;
  size_t local_30;
  char *local_28;
  Symbol *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_20 = in_RSI;
  if (*(int *)(in_RDI + 8) == 1) {
    local_10._M_len = in_RDX;
    local_10._M_str = in_RCX;
    Symbol::getParentScope(in_RSI);
    printScope((TypePrinter *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_20->name);
    if (bVar1) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
      if (bVar1) {
        std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                  ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                   0x13ce659);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe10,
                   (char *)in_stack_fffffffffffffe08);
        str_00._M_str = in_stack_fffffffffffffe20;
        str_00._M_len = (size_t)in_stack_fffffffffffffe18;
        FormatBuffer::append(in_stack_fffffffffffffe10,str_00);
      }
      else {
        std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                  ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                   0x13ce69c);
        local_50 = local_10._M_len;
        local_48 = local_10._M_str;
        str_01._M_str = in_stack_fffffffffffffe20;
        str_01._M_len = (size_t)in_stack_fffffffffffffe18;
        FormatBuffer::append(in_stack_fffffffffffffe10,str_01);
      }
    }
    else {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0x13ce5fb);
      local_30 = (local_20->name)._M_len;
      local_28 = (local_20->name)._M_str;
      str._M_str = in_stack_fffffffffffffe20;
      str._M_len = (size_t)in_stack_fffffffffffffe18;
      FormatBuffer::append(in_stack_fffffffffffffe10,str);
    }
  }
  else {
    this_00 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
              operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                          *)0x13ce6e9);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe10,
               (char *)in_stack_fffffffffffffe08);
    str_02._M_str = in_stack_fffffffffffffe20;
    str_02._M_len = (size_t)in_stack_fffffffffffffe18;
    FormatBuffer::append(in_stack_fffffffffffffe10,str_02);
    if ((*(byte *)(in_RDI + 5) & 1) != 0) {
      in_stack_fffffffffffffe40 = (char *)(in_RDI + 0x10);
      in_stack_fffffffffffffe38 =
           std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                      0x13ce73e);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe10,
                 (char *)in_stack_fffffffffffffe08);
      str_03._M_str = in_stack_fffffffffffffe20;
      str_03._M_len = (size_t)in_stack_fffffffffffffe18;
      FormatBuffer::append(in_stack_fffffffffffffe10,str_03);
      in_stack_fffffffffffffe50 =
           std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                      0x13ce77b);
      in_stack_fffffffffffffe48 = (Scope *)local_a0;
      Type::toString_abi_cxx11_((Type *)in_stack_fffffffffffffe38);
      local_a0._32_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe00);
      str_04._M_str = in_stack_fffffffffffffe20;
      str_04._M_len = (size_t)in_stack_fffffffffffffe18;
      FormatBuffer::append(in_stack_fffffffffffffe10,str_04);
      std::__cxx11::string::~string(in_stack_fffffffffffffe00);
    }
    args = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                      0x13ce81a);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe10,
               (char *)in_stack_fffffffffffffe08);
    str_05._M_str = in_stack_fffffffffffffe20;
    str_05._M_len = (size_t)in_stack_fffffffffffffe18;
    FormatBuffer::append(in_stack_fffffffffffffe10,str_05);
    bVar3 = 1;
    sVar2 = EnumType::values((EnumType *)0x13ce862);
    this_01 = (subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
               *)&stack0xffffffffffffff20;
    local_e8 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
               ::begin(this_01);
    local_f0 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
               ::end(this_01);
    while (bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                             ((self_type *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_f8 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                 ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                              *)0x13ce8d9);
      if ((bVar3 & 1) == 0) {
        std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                  ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                   0x13ce8f9);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe10,
                   (char *)in_stack_fffffffffffffe08);
        str_06._M_str = in_stack_fffffffffffffe20;
        str_06._M_len = (size_t)in_stack_fffffffffffffe18;
        FormatBuffer::append(in_stack_fffffffffffffe10,str_06);
      }
      in_stack_fffffffffffffe08 = local_f8;
      SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffe00);
      referencingRange.endLoc._0_7_ = in_stack_ffffffffffffff38;
      referencingRange.startLoc = (SourceLocation)this_01;
      referencingRange.endLoc._7_1_ = bVar3;
      EnumValueSymbol::getValue((EnumValueSymbol *)sVar2._M_end.current.current,referencingRange);
      local_110 = slang::ConstantValue::integer((ConstantValue *)0x13ce968);
      in_stack_fffffffffffffe10 =
           std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                      0x13ce97e);
      local_130 = "{}={}";
      local_128 = 5;
      in_stack_fffffffffffffe18 = &(local_f8->super_ValueSymbol).super_Symbol.name;
      in_stack_fffffffffffffe20 = local_150;
      SVInt::toString_abi_cxx11_
                (in_stack_fffffffffffffe88,(LiteralBase)((ulong)in_stack_fffffffffffffe80 >> 0x38),
                 SUB81((ulong)in_stack_fffffffffffffe80 >> 0x30,0),
                 (bitwidth_t)in_stack_fffffffffffffe80);
      fmt_00.str.size_ = in_RDI;
      fmt_00.str.data_ = in_stack_fffffffffffffe60;
      FormatBuffer::
      format<std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string>
                (this_00,fmt_00,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48);
      std::__cxx11::string::~string(in_stack_fffffffffffffe00);
      bVar3 = 0;
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
      ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                  *)in_stack_fffffffffffffe00);
    }
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0x13cea5a);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe10,
               (char *)in_stack_fffffffffffffe08);
    str_07._M_str = in_stack_fffffffffffffe20;
    str_07._M_len = (size_t)in_stack_fffffffffffffe18;
    FormatBuffer::append(in_stack_fffffffffffffe10,str_07);
    if ((*(byte *)(in_RDI + 3) & 1) == 0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
      if (bVar1) {
        Symbol::getParentScope(local_20);
        printScope((TypePrinter *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_20->name);
        if (bVar1) {
          std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
          operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                     0x13ceb38);
          fmt.str.size_ = (size_t)in_stack_fffffffffffffe48;
          fmt.str.data_ = in_stack_fffffffffffffe40;
          FormatBuffer::format<int_const&>(in_stack_fffffffffffffe38,fmt,(int *)args);
        }
        else {
          std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
          operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                     0x13ceb8a);
          str_09._M_str = in_stack_fffffffffffffe20;
          str_09._M_len = (size_t)in_stack_fffffffffffffe18;
          FormatBuffer::append(in_stack_fffffffffffffe10,str_09);
        }
      }
      else {
        std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                  ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                   0x13ceabc);
        str_08._M_str = in_stack_fffffffffffffe20;
        str_08._M_len = (size_t)in_stack_fffffffffffffe18;
        FormatBuffer::append(in_stack_fffffffffffffe10,str_08);
      }
    }
  }
  return;
}

Assistant:

void TypePrinter::visit(const EnumType& type, std::string_view overrideName) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        printScope(type.getParentScope());

        if (!type.name.empty())
            buffer->append(type.name);
        else if (overrideName.empty())
            buffer->append("<unnamed enum>");
        else
            buffer->append(overrideName);
    }
    else {
        buffer->append("enum");
        if (options.fullEnumType) {
            buffer->append(" ");
            buffer->append(type.baseType.toString());
        }
        buffer->append("{");

        bool first = true;
        for (const auto& member : type.values()) {
            if (!first)
                buffer->append(",");

            auto& value = member.getValue().integer();
            buffer->format("{}={}", member.name,
                           value.toString(LiteralBase::Decimal, /* includeBase */ true));
            first = false;
        }
        buffer->append("}");

        if (options.skipScopedTypeNames) {
            // Nothing to do here.
        }
        else if (!overrideName.empty()) {
            buffer->append(overrideName);
        }
        else {
            printScope(type.getParentScope());
            if (type.name.empty())
                buffer->format("e${}", type.systemId);
            else
                buffer->append(type.name);
        }
    }
}